

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Vehicle *v)

{
  pointer pcVar1;
  Person *p;
  ostream *poVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Vehicle{",8);
  std::__ostream_insert<char,std::char_traits<char>>(out," type: ",7);
  poVar2 = (ostream *)std::ostream::operator<<(out,v->type);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", age: ",7);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,v->_age);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", name: ",8);
  pcVar1 = (v->_name)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (v->_name)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", owner: ",9);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  p = (v->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
      super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
      super__Head_base<0UL,_Person_*,_false>._M_head_impl;
  if (p == (Person *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"{null}",6);
  }
  else {
    operator<<(out,p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vehicle& v)
  {
    out << "Vehicle{"
        << " type: " << v.type
        << ", age: " << v.age()
        << ", name: " << v.name()
        << ", owner: ";
    if (v.owner()) { out << *v.owner(); }
    else { out << "{null}"; }
    return out << " }";
  }